

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

Value * __thiscall
kj::_::Debug::Context::ensureInitialized(Value *__return_storage_ptr__,Context *this)

{
  int iVar1;
  char *pcVar2;
  String local_88;
  Value local_70;
  undefined1 local_45;
  String local_38;
  Value *local_20;
  Value *v;
  Context *this_local;
  Value *result;
  
  v = (Value *)this;
  this_local = (Context *)__return_storage_ptr__;
  local_20 = readMaybe<kj::_::Debug::Context::Value>(&this->value);
  if (local_20 == (Value *)0x0) {
    local_45 = 0;
    (*(this->super_ExceptionCallback)._vptr_ExceptionCallback[7])(__return_storage_ptr__);
    pcVar2 = __return_storage_ptr__->file;
    iVar1 = __return_storage_ptr__->line;
    heapString(&local_88,&__return_storage_ptr__->description);
    Value::Value(&local_70,pcVar2,iVar1,&local_88);
    Maybe<kj::_::Debug::Context::Value>::operator=(&this->value,&local_70);
    Value::~Value(&local_70);
    String::~String(&local_88);
  }
  else {
    pcVar2 = local_20->file;
    iVar1 = local_20->line;
    heapString(&local_38,&local_20->description);
    Value::Value(__return_storage_ptr__,pcVar2,iVar1,&local_38);
    String::~String(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Debug::Context::Value Debug::Context::ensureInitialized() {
  KJ_IF_MAYBE(v, value) {
    return Value(v->file, v->line, heapString(v->description));
  } else {
    Value result = evaluate();
    value = Value(result.file, result.line, heapString(result.description));
    return result;
  }